

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::SBC_ID_Y(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  this->cycles = 5;
  bVar6 = this->A;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar1 = ReadWord(this,(ushort)iVar2 & 0xff);
  this->cycles = this->cycles - 1;
  uVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->Y + uVar1));
  uVar5 = (uint)this->A - ((~(uint)(this->field_6).ps & 1) + (uVar3 & 0xff));
  bVar4 = (byte)uVar5;
  this->A = bVar4;
  uVar7 = bVar6 & 0xffffff80;
  bVar6 = ((bVar4 & 0x80) != (byte)uVar7) << 6;
  if ((uVar3 & 0x80) != uVar7) {
    bVar6 = 0;
  }
  (this->field_6).ps =
       (this->field_6).ps & 0x3c | (uVar5 & 0xff00) == 0 | (bVar4 == 0) * '\x02' | bVar6 |
       bVar4 & 0x80;
  return;
}

Assistant:

void CPU::SBC_ID_Y()
{
    cycles = 5;
    uint8_t acp = A, op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint16_t sum = A - op - !C;
    A = (sum & 0xFF);
    C = !((sum & 0xFF00) > 0);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}